

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenSIMDTernarySetC(BinaryenExpressionRef expr,BinaryenExpressionRef cExpr)

{
  if (expr->_id != SIMDTernaryId) {
    __assert_fail("expression->is<SIMDTernary>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xce9,
                  "void BinaryenSIMDTernarySetC(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (cExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)cExpr;
    return;
  }
  __assert_fail("cExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xcea,"void BinaryenSIMDTernarySetC(BinaryenExpressionRef, BinaryenExpressionRef)")
  ;
}

Assistant:

void BinaryenSIMDTernarySetC(BinaryenExpressionRef expr,
                             BinaryenExpressionRef cExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDTernary>());
  assert(cExpr);
  static_cast<SIMDTernary*>(expression)->c = (Expression*)cExpr;
}